

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++:110:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_xthread_test_c__:110:17)>
             *this)

{
  SourceLocation location;
  Executor *pEVar1;
  long in_FS_OFFSET;
  char local_241;
  undefined1 local_240 [16];
  DebugComparison<unsigned_int,_int> _kjCondition;
  undefined8 local_210;
  Fault f;
  PromiseFulfillerPair<unsigned_int> paf;
  WaitScope waitScope;
  EventLoop loop;
  UnixEventPort port;
  
  *(undefined1 *)(in_FS_OFFSET + -0x43) = 1;
  UnixEventPort::UnixEventPort(&port);
  EventLoop::EventLoop(&loop,&port.super_EventPort);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.fiber.ptr = (FiberBase *)0x0;
  waitScope.runningStacksPool.ptr = (FiberPool *)0x0;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  location.function._0_1_ = _kjCondition.result;
  location.fileName = (char *)_kjCondition.op.content.size_;
  location.function._1_7_ = _kjCondition._25_7_;
  location._16_8_ = local_210;
  newPromiseAndFulfiller<unsigned_int>(location);
  Own<kj::PromiseFulfiller<unsigned_int>,_std::nullptr_t>::operator=
            ((this->f).fulfiller,&paf.fulfiller);
  pEVar1 = getCurrentThreadExecutor();
  MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::lockExclusive
            ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)&_kjCondition,(this->f).executor);
  *(Executor **)_kjCondition.op.content.ptr = pEVar1;
  Locked<kj::Maybe<const_kj::Executor_&>_>::~Locked
            ((Locked<kj::Maybe<const_kj::Executor_&>_> *)&_kjCondition);
  _kjCondition.left = Promise<unsigned_int>::wait(&paf.promise,&waitScope);
  _kjCondition.right = 0x7b;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == 0x7b;
  if (_kjCondition.result) {
    MutexGuarded<kj::Maybe<const_kj::Executor_&>_>::lockExclusive
              ((MutexGuarded<kj::Maybe<const_kj::Executor_&>_> *)local_240,(this->f).executor);
    _kjCondition._0_8_ = &PTR_check_00581528;
    _kjCondition.op.content.ptr = &local_241;
    _kjCondition.op.content.size_ = local_240._8_8_;
    f.exception._0_1_ = 0;
    kj::_::Mutex::wait((Mutex *)local_240._0_8_,&_kjCondition);
    Locked<kj::Maybe<const_kj::Executor_&>_>::~Locked
              ((Locked<kj::Maybe<const_kj::Executor_&>_> *)local_240);
    PromiseFulfillerPair<unsigned_int>::~PromiseFulfillerPair(&paf);
    WaitScope::~WaitScope(&waitScope);
    EventLoop::~EventLoop(&loop);
    UnixEventPort::~UnixEventPort(&port);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-xthread-test.c++"
             ,0x78,FAILED,"paf.promise.wait(waitScope) == 123","_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }